

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O2

Error uv11::read_start(Stream *stream,AllocCb *alloc_cb,ReadCb *read_cb)

{
  AllocCb *this;
  int s;
  Error EVar2;
  error_category *peVar3;
  error_code eVar1;
  
  this = &(stream->super_Handle).on_alloc;
  std::function<void_(uv11::Handle_&,_unsigned_long,_uv_buf_t_*)>::operator=(this,alloc_cb);
  std::function<void_(uv11::Stream_&,_const_uv11::Buffer_&,_long,_std::error_code)>::operator=
            (&stream->on_read,read_cb);
  s = uv_read_start(stream->stream_ptr,read_start::anon_class_1_0_00000001::__invoke,
                    read_start::anon_class_1_0_00000001::__invoke);
  if (s != 0) {
    std::function<void_(uv11::Handle_&,_unsigned_long,_uv_buf_t_*)>::operator=(this,(nullptr_t)0x0);
    std::function<void_(uv11::Stream_&,_const_uv11::Buffer_&,_long,_std::error_code)>::operator=
              (&stream->on_read,(nullptr_t)0x0);
  }
  eVar1 = make_error(s);
  EVar2._M_value = eVar1._M_value;
  EVar2._4_4_ = eVar1._4_4_;
  register0x00000010 = eVar1._M_cat;
  return EVar2;
}

Assistant:

Error uv11::read_start(Stream& stream, AllocCb const& alloc_cb, ReadCb const& read_cb) {
    stream.on_alloc = alloc_cb;
    stream.on_read = read_cb;

    int s = ::uv_read_start(
        &stream.GetStream(),
        [](uv_handle_t* handle, ::size_t suggested_size, ::uv_buf_t* buf) {
            Handle* h = reinterpret_cast<Handle*>(handle->data);
            return h->on_alloc(*h, suggested_size, buf);
        },
        [](uv_stream_t* stream_ptr, ::ssize_t nread, ::uv_buf_t const* buf){
            Stream* strm = reinterpret_cast<Stream*>(stream_ptr->data);
            // FIXME: How do we handle errors - i.e. if nread < 0
            if (nread >= 0) {
                return strm->on_read(
                    *strm,
                    *buf,
                    nread,
                    make_error(0)
                );
            } else {
                return strm->on_read(
                    *strm,
                    *buf,
                    0,
                    make_error(static_cast<int>(nread))
                );
            }
        }
    );

    if (s) {
        stream.on_alloc = nullptr;
        stream.on_read = nullptr;
    }

    return make_error(s);
}